

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  bool bVar36;
  bool bVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  int overflow;
  secp256k1_scalar factor;
  secp256k1_scalar sec;
  int overflow_1;
  int local_c4;
  uchar *local_c0;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [16];
  
  local_c4 = 0;
  if (seckey == (uchar *)0x0) {
    secp256k1_ec_seckey_tweak_mul_cold_2();
  }
  else {
    if (tweak != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_b8,tweak,&local_c4);
      secp256k1_scalar_set_b32(&local_98,seckey,(int *)&local_78);
      bVar56 = (int)local_78 == 0;
      bVar36 = local_98.d[1] != 0;
      bVar37 = local_98.d[0] != 0;
      bVar34 = local_98.d[2] != 0;
      bVar33 = local_98.d[3] != 0;
      bVar57 = local_c4 == 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_98.d[0];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_b8.d[0];
      uVar39 = SUB168(auVar1 * auVar17,8);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar39;
      local_78 = SUB168(auVar1 * auVar17,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_98.d[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_b8.d[1];
      auVar2 = auVar2 * auVar18;
      uVar45 = SUB168(auVar2 + auVar35,0);
      uVar50 = SUB168(auVar2 + auVar35,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_98.d[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_b8.d[0];
      uVar40 = SUB168(auVar3 * auVar19,8);
      uVar38 = SUB168(auVar3 * auVar19,0);
      local_70 = uVar45 + uVar38;
      uVar38 = (ulong)CARRY8(uVar45,uVar38);
      uVar45 = uVar50 + uVar40;
      uVar51 = uVar45 + uVar38;
      uVar52 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar39,auVar2._0_8_)) +
               (ulong)(CARRY8(uVar50,uVar40) || CARRY8(uVar45,uVar38));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_98.d[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_b8.d[2];
      uVar41 = SUB168(auVar4 * auVar20,8);
      uVar38 = SUB168(auVar4 * auVar20,0);
      uVar39 = uVar51 + uVar38;
      uVar38 = (ulong)CARRY8(uVar51,uVar38);
      uVar40 = uVar52 + uVar41;
      uVar53 = uVar40 + uVar38;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_98.d[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_b8.d[1];
      uVar42 = SUB168(auVar5 * auVar21,8);
      uVar45 = SUB168(auVar5 * auVar21,0);
      uVar51 = uVar39 + uVar45;
      uVar45 = (ulong)CARRY8(uVar39,uVar45);
      uVar50 = uVar53 + uVar42;
      uVar54 = uVar50 + uVar45;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_98.d[2];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_b8.d[0];
      uVar43 = SUB168(auVar6 * auVar22,8);
      uVar39 = SUB168(auVar6 * auVar22,0);
      local_68 = uVar51 + uVar39;
      uVar39 = (ulong)CARRY8(uVar51,uVar39);
      uVar51 = uVar54 + uVar43;
      uVar55 = uVar51 + uVar39;
      uVar46 = (ulong)(CARRY8(uVar52,uVar41) || CARRY8(uVar40,uVar38)) +
               (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar50,uVar45)) +
               (ulong)(CARRY8(uVar54,uVar43) || CARRY8(uVar51,uVar39));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_98.d[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_b8.d[3];
      uVar43 = SUB168(auVar7 * auVar23,8);
      uVar38 = SUB168(auVar7 * auVar23,0);
      uVar39 = uVar55 + uVar38;
      uVar38 = (ulong)CARRY8(uVar55,uVar38);
      uVar50 = uVar46 + uVar43;
      uVar55 = uVar50 + uVar38;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_98.d[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_b8.d[2];
      uVar52 = SUB168(auVar8 * auVar24,8);
      uVar45 = SUB168(auVar8 * auVar24,0);
      uVar40 = uVar39 + uVar45;
      uVar45 = (ulong)CARRY8(uVar39,uVar45);
      uVar51 = uVar55 + uVar52;
      uVar47 = uVar51 + uVar45;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_98.d[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_b8.d[1];
      uVar53 = SUB168(auVar9 * auVar25,8);
      uVar39 = SUB168(auVar9 * auVar25,0);
      uVar42 = uVar40 + uVar39;
      uVar39 = (ulong)CARRY8(uVar40,uVar39);
      uVar41 = uVar47 + uVar53;
      uVar48 = uVar41 + uVar39;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_98.d[3];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_b8.d[0];
      uVar54 = SUB168(auVar10 * auVar26,8);
      uVar40 = SUB168(auVar10 * auVar26,0);
      local_60 = uVar42 + uVar40;
      uVar40 = (ulong)CARRY8(uVar42,uVar40);
      uVar42 = uVar48 + uVar54;
      uVar49 = uVar42 + uVar40;
      uVar52 = (ulong)(CARRY8(uVar46,uVar43) || CARRY8(uVar50,uVar38)) +
               (ulong)(CARRY8(uVar55,uVar52) || CARRY8(uVar51,uVar45)) +
               (ulong)(CARRY8(uVar47,uVar53) || CARRY8(uVar41,uVar39)) +
               (ulong)(CARRY8(uVar48,uVar54) || CARRY8(uVar42,uVar40));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_98.d[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_b8.d[3];
      uVar41 = SUB168(auVar11 * auVar27,8);
      uVar38 = SUB168(auVar11 * auVar27,0);
      uVar39 = uVar49 + uVar38;
      uVar38 = (ulong)CARRY8(uVar49,uVar38);
      uVar40 = uVar52 + uVar41;
      uVar53 = uVar40 + uVar38;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_98.d[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_b8.d[2];
      uVar42 = SUB168(auVar12 * auVar28,8);
      uVar45 = SUB168(auVar12 * auVar28,0);
      uVar51 = uVar39 + uVar45;
      uVar45 = (ulong)CARRY8(uVar39,uVar45);
      uVar50 = uVar53 + uVar42;
      uVar54 = uVar50 + uVar45;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_98.d[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_b8.d[1];
      uVar43 = SUB168(auVar13 * auVar29,8);
      uVar39 = SUB168(auVar13 * auVar29,0);
      local_58 = uVar51 + uVar39;
      uVar39 = (ulong)CARRY8(uVar51,uVar39);
      uVar51 = uVar54 + uVar43;
      uVar46 = uVar51 + uVar39;
      uVar41 = (ulong)(CARRY8(uVar52,uVar41) || CARRY8(uVar40,uVar38)) +
               (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar50,uVar45)) +
               (ulong)(CARRY8(uVar54,uVar43) || CARRY8(uVar51,uVar39));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_98.d[2];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_b8.d[3];
      uVar50 = SUB168(auVar14 * auVar30,8);
      uVar38 = SUB168(auVar14 * auVar30,0);
      uVar40 = uVar46 + uVar38;
      uVar38 = (ulong)CARRY8(uVar46,uVar38);
      uVar39 = uVar41 + uVar50;
      uVar42 = uVar39 + uVar38;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_98.d[3];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_b8.d[2];
      uVar51 = SUB168(auVar15 * auVar31,8);
      uVar45 = SUB168(auVar15 * auVar31,0);
      local_50 = uVar40 + uVar45;
      uVar45 = (ulong)CARRY8(uVar40,uVar45);
      uVar40 = uVar42 + uVar51;
      local_48._8_8_ =
           (ulong)(CARRY8(uVar41,uVar50) || CARRY8(uVar39,uVar38)) +
           (ulong)(CARRY8(uVar42,uVar51) || CARRY8(uVar40,uVar45));
      local_48._0_8_ = uVar40 + uVar45;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_98.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_b8.d[3];
      local_48 = auVar16 * auVar32 + local_48;
      local_c0 = seckey;
      secp256k1_scalar_reduce_512(&local_98,&local_78);
      uVar44 = (uint)(((((local_b8.d[1] != 0 || local_b8.d[0] != 0) || local_b8.d[2] != 0) ||
                       local_b8.d[3] != 0) && bVar57) &&
                     ((((bVar36 || bVar37) || bVar34) || bVar33) && bVar56));
      uVar38 = (ulong)(uVar44 ^ 1) - 1;
      local_98.d[0] = local_98.d[0] & uVar38;
      local_98.d[1] = local_98.d[1] & uVar38;
      local_98.d[2] = local_98.d[2] & uVar38;
      local_98.d[3] = local_98.d[3] & uVar38;
      secp256k1_scalar_get_b32(local_c0,&local_98);
      return uVar44;
    }
    secp256k1_ec_seckey_tweak_mul_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&factor, tweak, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}